

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMockerBase<unsigned_char_(unsigned_short)>::PerformDefaultAction
          (FunctionMockerBase<unsigned_char_(unsigned_short)> *this,type args,
          string *call_description)

{
  bool bVar1;
  OnCallSpec<unsigned_char_(unsigned_short)> *this_00;
  Action<unsigned_char_(unsigned_short)> *this_01;
  runtime_error *this_02;
  undefined1 local_58 [8];
  string message;
  OnCallSpec<unsigned_char_(unsigned_short)> *spec;
  string *call_description_local;
  type args_local;
  FunctionMockerBase<unsigned_char_(unsigned_short)> *this_local;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<unsigned_char_(unsigned_short)> *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    bVar1 = DefaultValue<unsigned_char>::Exists();
    if (!bVar1) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,(string *)local_58);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local._7_1_ = DefaultValue<unsigned_char>::Get();
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    this_01 = OnCallSpec<unsigned_char_(unsigned_short)>::GetAction(this_00);
    std::tuple<unsigned_short>::tuple((tuple<unsigned_short> *)((long)&message.field_2 + 0xe),args);
    this_local._7_1_ =
         Action<unsigned_char_(unsigned_short)>::Perform
                   (this_01,(ArgumentTuple *)((long)&message.field_2 + 0xe));
  }
  return this_local._7_1_;
}

Assistant:

Result PerformDefaultAction(
      typename RvalueRef<typename Function<F>::ArgumentTuple>::type args,
      const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(internal::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }